

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNMatrix SUNBandMatrixStorage
                    (sunindextype N,sunindextype mu,sunindextype ml,sunindextype smu,
                    SUNContext_conflict sunctx)

{
  SUNMatrix p_Var1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sunindextype colSize;
  sunindextype j;
  SUNMatrixContent_Band content;
  SUNMatrix A;
  SUNContext_conflict sunctx_local_scope_;
  long local_48;
  
  p_Var1 = (SUNMatrix)SUNMatNewEmpty(in_R8);
  p_Var1->ops->getid = SUNMatGetID_Band;
  p_Var1->ops->clone = SUNMatClone_Band;
  p_Var1->ops->destroy = SUNMatDestroy_Band;
  p_Var1->ops->zero = SUNMatZero_Band;
  p_Var1->ops->copy = SUNMatCopy_Band;
  p_Var1->ops->scaleadd = SUNMatScaleAdd_Band;
  p_Var1->ops->scaleaddi = SUNMatScaleAddI_Band;
  p_Var1->ops->matvec = SUNMatMatvec_Band;
  p_Var1->ops->space = SUNMatSpace_Band;
  plVar2 = (long *)malloc(0x48);
  p_Var1->content = plVar2;
  lVar3 = in_RCX + in_RDX + 1;
  *plVar2 = in_RDI;
  plVar2[1] = in_RDI;
  plVar2[3] = in_RSI;
  plVar2[4] = in_RDX;
  plVar2[5] = in_RCX;
  plVar2[2] = lVar3;
  plVar2[7] = in_RDI * lVar3;
  plVar2[6] = 0;
  plVar2[8] = 0;
  pvVar4 = calloc(in_RDI * lVar3,8);
  plVar2[6] = (long)pvVar4;
  pvVar4 = malloc(in_RDI << 3);
  plVar2[8] = (long)pvVar4;
  for (local_48 = 0; local_48 < in_RDI; local_48 = local_48 + 1) {
    *(long *)(plVar2[8] + local_48 * 8) = plVar2[6] + local_48 * lVar3 * 8;
  }
  return p_Var1;
}

Assistant:

SUNMatrix SUNBandMatrixStorage(sunindextype N, sunindextype mu, sunindextype ml,
                               sunindextype smu, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNMatrix A;
  SUNMatrixContent_Band content;
  sunindextype j, colSize;

  SUNAssertNull(N > 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(smu >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(ml >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Band;
  A->ops->clone     = SUNMatClone_Band;
  A->ops->destroy   = SUNMatDestroy_Band;
  A->ops->zero      = SUNMatZero_Band;
  A->ops->copy      = SUNMatCopy_Band;
  A->ops->scaleadd  = SUNMatScaleAdd_Band;
  A->ops->scaleaddi = SUNMatScaleAddI_Band;
  A->ops->matvec    = SUNMatMatvec_Band;
  A->ops->space     = SUNMatSpace_Band;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Band)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  A->content = content;

  /* Fill content */
  colSize        = smu + ml + 1;
  content->M     = N;
  content->N     = N;
  content->mu    = mu;
  content->ml    = ml;
  content->s_mu  = smu;
  content->ldim  = colSize;
  content->ldata = N * colSize;
  content->data  = NULL;
  content->cols  = NULL;

  /* Allocate content */
  content->data = (sunrealtype*)calloc(N * colSize, sizeof(sunrealtype));
  SUNAssertNull(content->data, SUN_ERR_MALLOC_FAIL);

  content->cols = (sunrealtype**)malloc(N * sizeof(sunrealtype*));
  SUNAssertNull(content->cols, SUN_ERR_MALLOC_FAIL);
  for (j = 0; j < N; j++) { content->cols[j] = content->data + j * colSize; }

  return (A);
}